

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * __thiscall
cmGeneratorExpressionInterpreter::Evaluate
          (cmGeneratorExpressionInterpreter *this,string *expression,string *property)

{
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *__p;
  bool bVar1;
  string *psVar2;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator<char> local_e1;
  string local_e0;
  string local_c0 [32];
  cmGeneratorExpressionDAGChecker local_a0;
  
  std::__cxx11::string::string(local_c0,(string *)expression);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_a0,(string *)this);
  __p = local_a0.Parent;
  local_a0.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
  std::
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ::reset((__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           *)&this->CompiledGeneratorExpression,(pointer)__p);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_a0);
  std::__cxx11::string::~string(local_c0);
  target = this->HeadTarget;
  bVar1 = std::operator==(property,"COMPILE_FLAGS");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"COMPILE_OPTIONS",&local_e1);
  }
  else {
    std::__cxx11::string::string((string *)&local_e0,(string *)property);
  }
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&local_a0,target,&local_e0,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_e0);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     ((this->CompiledGeneratorExpression)._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      this->LocalGenerator,&this->Config,this->HeadTarget,&local_a0,
                      (cmGeneratorTarget *)0x0,&this->Language);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_a0);
  return psVar2;
}

Assistant:

const std::string& cmGeneratorExpressionInterpreter::Evaluate(
  std::string expression, const std::string& property)
{
  this->CompiledGeneratorExpression =
    this->GeneratorExpression.Parse(std::move(expression));

  // Specify COMPILE_OPTIONS to DAGchecker, same semantic as COMPILE_FLAGS
  cmGeneratorExpressionDAGChecker dagChecker(
    this->HeadTarget,
    property == "COMPILE_FLAGS" ? "COMPILE_OPTIONS" : property, nullptr,
    nullptr);

  return this->CompiledGeneratorExpression->Evaluate(
    this->LocalGenerator, this->Config, this->HeadTarget, &dagChecker, nullptr,
    this->Language);
}